

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_append_clause(textblock *tb,bitflag *f,uint8_t attr,char *start,char *conjunction,
                       char *end)

{
  int iVar1;
  wchar_t flag;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  
  iVar1 = flag_count(f,0xc);
  if (iVar1 == 0) {
    return;
  }
  textblock_append(tb,"%s",start);
  iVar3 = 1;
  while (flag = flag_next(f,0xc,iVar3), flag != L'\0') {
    wVar2 = flag_next(f,0xc,1);
    if (flag != wVar2) {
      if (2 < iVar1) {
        textblock_append(tb,",");
      }
      iVar3 = flag_next(f,0xc,flag + L'\x01');
      if (iVar3 == 0) {
        textblock_append(tb," ");
        textblock_append(tb,"%s",conjunction);
      }
      textblock_append(tb," ");
    }
    iVar3 = flag + L'\x01';
    pcVar4 = describe_race_flag(flag);
    textblock_append_c(tb,attr,"%s",pcVar4);
  }
  textblock_append(tb,"%s",end);
  return;
}

Assistant:

static void lore_append_clause(textblock *tb, bitflag *f, uint8_t attr,
							   const char *start, const char *conjunction,
							   const char *end)
{
	int count = rf_count(f);
	bool comma = count > 2;

	if (count) {
		int flag;
		textblock_append(tb, "%s", start);
		for (flag = rf_next(f, FLAG_START); flag; flag = rf_next(f, flag + 1)) {
			/* First entry starts immediately */
			if (flag != rf_next(f, FLAG_START)) {
				if (comma) {
					textblock_append(tb, ",");
				}
				/* Last entry */
				if (rf_next(f, flag + 1) == FLAG_END) {
					textblock_append(tb, " ");
					textblock_append(tb, "%s", conjunction);
				}
				textblock_append(tb, " ");
			}
			textblock_append_c(tb, attr, "%s", describe_race_flag(flag));
		}
		textblock_append(tb, "%s", end);
	}
}